

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O3

void Llb_MtrFree(Llb_Mtr_t *p)

{
  int iVar1;
  long lVar2;
  
  if (p->pProdVars != (char *)0x0) {
    free(p->pProdVars);
    p->pProdVars = (char *)0x0;
  }
  if (p->pProdNums != (int *)0x0) {
    free(p->pProdNums);
    p->pProdNums = (int *)0x0;
  }
  iVar1 = p->nCols;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (p->pMatrix[lVar2] != (char *)0x0) {
        free(p->pMatrix[lVar2]);
        p->pMatrix[lVar2] = (char *)0x0;
        iVar1 = p->nCols;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (p->pRowSums != (int *)0x0) {
    free(p->pRowSums);
    p->pRowSums = (int *)0x0;
  }
  if (p->pColSums != (int *)0x0) {
    free(p->pColSums);
    p->pColSums = (int *)0x0;
  }
  if (p->pMatrix != (char **)0x0) {
    free(p->pMatrix);
    p->pMatrix = (char **)0x0;
  }
  if (p->pColGrps != (Llb_Grp_t **)0x0) {
    free(p->pColGrps);
  }
  free(p);
  return;
}

Assistant:

void Llb_MtrFree( Llb_Mtr_t * p )
{
    int i;
    ABC_FREE( p->pProdVars );
    ABC_FREE( p->pProdNums );
    for ( i = 0; i < p->nCols; i++ )
        ABC_FREE( p->pMatrix[i] );
    ABC_FREE( p->pRowSums );
    ABC_FREE( p->pColSums );
    ABC_FREE( p->pMatrix );
    ABC_FREE( p->pColGrps );
    ABC_FREE( p );
}